

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O1

void __thiscall BufferedReader::deleteReader(BufferedReader *this,int readerID)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  iterator __position;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_readersMtx);
  if (iVar3 == 0) {
    p_Var1 = &(this->m_readers)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < readerID]
        ) {
      if (readerID <= (int)p_Var2[1]._M_color) {
        p_Var4 = p_Var2;
      }
    }
    __position._M_node = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (__position._M_node = p_Var4, readerID < (int)p_Var4[1]._M_color)) {
      __position._M_node = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      p_Var2 = __position._M_node[1]._M_parent;
      if (*(int *)((long)&p_Var2->_M_left + 4) < 1) {
        if (p_Var2 != (_Base_ptr)0x0) {
          (**(code **)(*(long *)p_Var2 + 8))();
        }
        std::
        _Rb_tree<int,std::pair<int_const,ReaderData*>,std::_Select1st<std::pair<int_const,ReaderData*>>,std::less<int>,std::allocator<std::pair<int_const,ReaderData*>>>
        ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,ReaderData*>,std::_Select1st<std::pair<int_const,ReaderData*>>,std::less<int>,std::allocator<std::pair<int_const,ReaderData*>>>
                            *)&this->m_readers,__position);
      }
      else {
        *(undefined1 *)&p_Var2->_M_left = 1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void BufferedReader::deleteReader(const int readerID)
{
    {
        std::lock_guard lock(m_readersMtx);
        const auto iterator = m_readers.find(readerID);
        if (iterator == m_readers.end())
            return;
        ReaderData* data = iterator->second;
        if (data->m_atQueue > 0)
            data->m_deleted = true;  // There are requests in the queue for reading into this structure.
        else
        {
            delete iterator->second;  // No outstanding requests for reading in the queue. Delete immediately.
            m_readers.erase(iterator);
        }
    }
}